

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O3

void obj_moveoutletfirst(t_object *x,_outlet *o)

{
  _outlet *p_Var1;
  _outlet *p_Var2;
  _outlet *p_Var3;
  
  p_Var1 = x->te_outlet;
  p_Var2 = p_Var1;
  if (p_Var1 != o) {
    do {
      p_Var3 = p_Var2;
      if (p_Var3 == (_outlet *)0x0) {
        return;
      }
      p_Var2 = p_Var3->o_next;
    } while (p_Var3->o_next != o);
    p_Var3->o_next = o->o_next;
    o->o_next = p_Var1;
    x->te_outlet = o;
  }
  return;
}

Assistant:

void obj_moveoutletfirst(t_object *x, t_outlet *o)
{
    t_outlet *o2;
    if (x->ob_outlet == o) return;
    else for (o2 = x->ob_outlet; o2; o2 = o2->o_next)
        if (o2->o_next == o)
    {
        o2->o_next = o->o_next;
        o->o_next = x->ob_outlet;
        x->ob_outlet = o;
        return;
    }
}